

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Poly::Get_y(ChFunction_Poly *this,double x)

{
  bool bVar1;
  long lVar2;
  undefined1 auVar3 [64];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  
  if (this->order < 0) {
    dVar4 = 0.0;
  }
  else {
    auVar5 = ZEXT816(0);
    lVar2 = 0;
    do {
      auVar6._0_8_ = auVar5._0_8_;
      dVar4 = this->coeff[lVar2];
      auVar3._0_8_ = pow(x,(double)(int)lVar2);
      auVar3._8_56_ = extraout_var;
      auVar6._8_8_ = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar4;
      auVar5 = vfmadd231sd_fma(auVar6,auVar3._0_16_,auVar5);
      dVar4 = auVar5._0_8_;
      bVar1 = lVar2 < this->order;
      lVar2 = lVar2 + 1;
    } while (bVar1);
  }
  return dVar4;
}

Assistant:

double ChFunction_Poly::Get_y(double x) const {
    double total = 0;
    for (int i = 0; i <= order; i++) {
        total += (coeff[i] * pow(x, (double)i));
    }
    return total;
}